

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

void xmlCompileAttributeTest(xmlPatParserContextPtr ctxt)

{
  xmlDictPtr pxVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  xmlChar *value;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  long lVar7;
  long lVar8;
  
  pbVar2 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar2 + 1;
    pbVar2 = pbVar2 + 1;
  }
  value = xmlPatScanNCName(ctxt);
  if (ctxt->error < 0) {
    return;
  }
  pxVar5 = ctxt->cur;
  if (value == (xmlChar *)0x0) {
    if (*pxVar5 != '*') {
      ctxt->error = 1;
      return;
    }
    value = (xmlChar *)0x0;
    iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,(xmlChar *)0x0,(xmlChar *)0x0);
    pxVar6 = (xmlChar *)0x0;
    pxVar5 = (xmlChar *)0x0;
    if (iVar4 == 0) {
      if (*ctxt->cur == '\0') {
        return;
      }
      ctxt->cur = ctxt->cur + 1;
      return;
    }
    goto LAB_001737cd;
  }
  if (*pxVar5 != ':') {
    pxVar6 = (xmlChar *)0x0;
    iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,value,(xmlChar *)0x0);
    pxVar5 = (xmlChar *)0x0;
    if (iVar4 == 0) {
      return;
    }
    goto LAB_001737cd;
  }
  ctxt->cur = pxVar5 + 1;
  if (((ulong)pxVar5[1] < 0x21) && ((0x100002600U >> ((ulong)pxVar5[1] & 0x3f) & 1) != 0)) {
    ctxt->error = 1;
    pxVar6 = (xmlChar *)0x0;
LAB_00173754:
    bVar3 = false;
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar5 = xmlPatScanName(ctxt);
    if ((*value == 'x') && (((value[1] == 'm' && (value[2] == 'l')) && (value[3] == '\0')))) {
      pxVar1 = ctxt->comp->dict;
      if (pxVar1 == (xmlDictPtr)0x0) {
        pxVar6 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
      }
      else {
        pxVar6 = xmlDictLookup(pxVar1,(xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
      }
LAB_001738d2:
      if (ctxt->comp->dict == (xmlDictPtr)0x0) {
        (*xmlFree)(value);
      }
      if (pxVar5 == (xmlChar *)0x0) {
        if (*ctxt->cur == '*') {
          ctxt->cur = ctxt->cur + 1;
          value = (xmlChar *)0x0;
          iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,(xmlChar *)0x0,pxVar6);
          if (iVar4 == 0) goto LAB_0017394d;
        }
        else {
          ctxt->error = 1;
          value = (xmlChar *)0x0;
        }
        goto LAB_00173754;
      }
      iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,pxVar5,pxVar6);
      if (iVar4 != 0) {
        value = (xmlChar *)0x0;
        goto LAB_00173915;
      }
LAB_0017394d:
      bVar3 = true;
      value = (xmlChar *)0x0;
    }
    else {
      if (ctxt->nb_namespaces < 1) {
        lVar8 = 0;
      }
      else {
        lVar7 = 0;
        lVar8 = 0;
        do {
          iVar4 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar7 + 8),value);
          if (iVar4 != 0) {
            pxVar1 = ctxt->comp->dict;
            pxVar6 = *(xmlChar **)((long)ctxt->namespaces + lVar7);
            if (pxVar1 == (xmlDictPtr)0x0) {
              pxVar6 = xmlStrdup(pxVar6);
            }
            else {
              pxVar6 = xmlDictLookup(pxVar1,pxVar6,-1);
            }
            goto LAB_001738cc;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar8 < ctxt->nb_namespaces);
      }
      pxVar6 = (xmlChar *)0x0;
LAB_001738cc:
      if ((int)lVar8 < ctxt->nb_namespaces) goto LAB_001738d2;
      ctxt->error = 1;
LAB_00173915:
      bVar3 = false;
    }
  }
  if (bVar3) {
    return;
  }
LAB_001737cd:
  if ((value != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(value);
  }
  if ((pxVar6 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar6);
  }
  if ((pxVar5 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar5);
    return;
  }
  return;
}

Assistant:

static void
xmlCompileAttributeTest(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;

    SKIP_BLANKS;
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    PUSH(XML_OP_ATTR, NULL, NULL);
	    NEXT;
	} else {
	    ERROR(NULL, NULL, NULL,
		"xmlCompileAttributeTest : Name expected\n");
	    ctxt->error = 1;
	}
	return;
    }
    if (CUR == ':') {
	int i;
	xmlChar *prefix = name;

	NEXT;

	if (IS_BLANK_CH(CUR)) {
	    ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
	    ctxt->error = 1;
	    goto error;
	}
	/*
	* This is a namespace match
	*/
	token = xmlPatScanName(ctxt);
	if ((prefix[0] == 'x') &&
	    (prefix[1] == 'm') &&
	    (prefix[2] == 'l') &&
	    (prefix[3] == 0))
	{
	    XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE);
	} else {
	    for (i = 0;i < ctxt->nb_namespaces;i++) {
		if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
		    XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
		    break;
		}
	    }
	    if (i >= ctxt->nb_namespaces) {
		ERROR5(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : no namespace bound to prefix %s\n",
		    prefix);
		ctxt->error = 1;
		goto error;
	    }
	}
        XML_PAT_FREE_STRING(ctxt, name);
        name = NULL;
	if (token == NULL) {
	    if (CUR == '*') {
		NEXT;
		PUSH(XML_OP_ATTR, NULL, URL);
	    } else {
		ERROR(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : Name expected\n");
		ctxt->error = 1;
		goto error;
	    }
	} else {
	    PUSH(XML_OP_ATTR, token, URL);
	}
    } else {
	PUSH(XML_OP_ATTR, name, NULL);
    }
    return;
error:
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name);
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token);
}